

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App_inl.hpp
# Opt level: O0

App * __thiscall
CLI::App::add_subcommand(App *this,string *subcommand_name,string *subcommand_description)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  IncorrectConstruction *pIVar4;
  reference pcVar5;
  App *pAVar6;
  shared_ptr<CLI::App> local_148;
  undefined1 local_131;
  string local_130;
  string local_110;
  undefined1 local_f0 [8];
  App_p subcom;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  char local_71;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_70;
  char c;
  iterator __end2;
  iterator __begin2;
  string *__range2;
  allocator local_41;
  string local_40;
  string *local_20;
  string *subcommand_description_local;
  string *subcommand_name_local;
  App *this_local;
  
  local_20 = subcommand_description;
  subcommand_description_local = subcommand_name;
  subcommand_name_local = (string *)this;
  uVar2 = ::std::__cxx11::string::empty();
  if (((uVar2 & 1) == 0) && (bVar1 = detail::valid_name_string(subcommand_name), !bVar1)) {
    pcVar3 = (char *)::std::__cxx11::string::operator[]((ulong)subcommand_name);
    bVar1 = detail::valid_first_char<char>(*pcVar3);
    if (!bVar1) {
      pIVar4 = (IncorrectConstruction *)__cxa_allocate_exception(0x38);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_40,
                 "Subcommand name starts with invalid character, \'!\' and \'-\' and control characters"
                 ,&local_41);
      IncorrectConstruction::IncorrectConstruction(pIVar4,&local_40);
      __cxa_throw(pIVar4,&IncorrectConstruction::typeinfo,
                  IncorrectConstruction::~IncorrectConstruction);
    }
    __end2._M_current = (char *)::std::__cxx11::string::begin();
    _Stack_70._M_current = (char *)::std::__cxx11::string::end();
    while (bVar1 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffff90), bVar1) {
      pcVar5 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&__end2);
      local_71 = *pcVar5;
      bVar1 = detail::valid_later_char<char>(local_71);
      if (!bVar1) {
        subcom.super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_1_ = 1;
        pIVar4 = (IncorrectConstruction *)__cxa_allocate_exception(0x38);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&local_d8,"Subcommand name contains invalid character (\'",
                   (allocator *)
                   ((long)&subcom.super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi + 7));
        ::std::operator+(&local_b8,&local_d8,local_71);
        ::std::operator+(&local_98,&local_b8,
                         "\'), all characters are allowed except\'=\',\':\',\'{\',\'}\', \' \', and control characters"
                        );
        IncorrectConstruction::IncorrectConstruction(pIVar4,&local_98);
        subcom.super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_1_ = 0;
        __cxa_throw(pIVar4,&IncorrectConstruction::typeinfo,
                    IncorrectConstruction::~IncorrectConstruction);
      }
      __gnu_cxx::
      __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end2);
    }
  }
  pAVar6 = (App *)operator_new(0x360);
  local_131 = 1;
  ::std::__cxx11::string::string((string *)&local_110,(string *)subcommand_description);
  ::std::__cxx11::string::string((string *)&local_130,(string *)subcommand_name);
  App(pAVar6,&local_110,&local_130,this);
  local_131 = 0;
  ::std::shared_ptr<CLI::App>::shared_ptr<CLI::App,void>((shared_ptr<CLI::App> *)local_f0,pAVar6);
  ::std::__cxx11::string::~string((string *)&local_130);
  ::std::__cxx11::string::~string((string *)&local_110);
  std::shared_ptr<CLI::App>::shared_ptr(&local_148,(shared_ptr<CLI::App> *)local_f0);
  pAVar6 = add_subcommand(this,&local_148);
  std::shared_ptr<CLI::App>::~shared_ptr(&local_148);
  std::shared_ptr<CLI::App>::~shared_ptr((shared_ptr<CLI::App> *)local_f0);
  return pAVar6;
}

Assistant:

CLI11_INLINE App *App::add_subcommand(std::string subcommand_name, std::string subcommand_description) {
    if(!subcommand_name.empty() && !detail::valid_name_string(subcommand_name)) {
        if(!detail::valid_first_char(subcommand_name[0])) {
            throw IncorrectConstruction(
                "Subcommand name starts with invalid character, '!' and '-' and control characters");
        }
        for(auto c : subcommand_name) {
            if(!detail::valid_later_char(c)) {
                throw IncorrectConstruction(std::string("Subcommand name contains invalid character ('") + c +
                                            "'), all characters are allowed except"
                                            "'=',':','{','}', ' ', and control characters");
            }
        }
    }
    CLI::App_p subcom = std::shared_ptr<App>(new App(std::move(subcommand_description), subcommand_name, this));
    return add_subcommand(std::move(subcom));
}